

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ciphercommon_gcm.c
# Opt level: O0

int ossl_gcm_stream_final(void *vctx,uchar *out,size_t *outl,size_t outsize)

{
  int iVar1;
  size_t in_RCX;
  uchar *in_RDX;
  size_t *in_RSI;
  uchar *in_RDI;
  int i;
  PROV_GCM_CTX *ctx;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = gcm_cipher_internal((PROV_GCM_CTX *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                                ,in_RSI,in_RDX,in_RCX);
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    else {
      in_RDX[0] = '\0';
      in_RDX[1] = '\0';
      in_RDX[2] = '\0';
      in_RDX[3] = '\0';
      in_RDX[4] = '\0';
      in_RDX[5] = '\0';
      in_RDX[6] = '\0';
      in_RDX[7] = '\0';
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int ossl_gcm_stream_final(void *vctx, unsigned char *out, size_t *outl,
                          size_t outsize)
{
    PROV_GCM_CTX *ctx = (PROV_GCM_CTX *)vctx;
    int i;

    if (!ossl_prov_is_running())
        return 0;

    i = gcm_cipher_internal(ctx, out, outl, NULL, 0);
    if (i <= 0)
        return 0;

    *outl = 0;
    return 1;
}